

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toolbar.cpp
# Opt level: O2

void __thiscall QtMWidgets::ToolBar::ToolBar(ToolBar *this,QWidget *parent)

{
  ToolBarPrivate *this_00;
  undefined1 local_28 [8];
  
  QWidget::QWidget(&this->super_QWidget,parent,0);
  *(undefined ***)this = &PTR_metaObject_001a9ff8;
  *(undefined ***)&this->field_0x10 = &PTR__ToolBar_001aa1a8;
  this_00 = (ToolBarPrivate *)operator_new(0x28);
  this_00->q = this;
  (this_00->iconSize).wd = -1;
  (this_00->iconSize).ht = -1;
  this_00->layout = (ToolBarLayout *)0x0;
  this_00->left = (NavigationArrow *)0x0;
  this_00->right = (NavigationArrow *)0x0;
  (this->d).d = this_00;
  ToolBarPrivate::init(this_00,(EVP_PKEY_CTX *)parent);
  QObject::connect<void(QtMWidgets::NavigationArrow::*)(),void(QtMWidgets::ToolBar::*)()>
            ((Object *)&stack0xffffffffffffffe0,
             (offset_in_NavigationArrow_to_subr)((this->d).d)->left,
             (Object *)NavigationArrow::clicked,0,(ConnectionType)this);
  QMetaObject::Connection::~Connection((Connection *)&stack0xffffffffffffffe0);
  QObject::connect<void(QtMWidgets::NavigationArrow::*)(),void(QtMWidgets::ToolBar::*)()>
            ((Object *)local_28,(offset_in_NavigationArrow_to_subr)((this->d).d)->right,
             (Object *)NavigationArrow::clicked,0,(ConnectionType)this);
  QMetaObject::Connection::~Connection((Connection *)local_28);
  return;
}

Assistant:

ToolBar::ToolBar( QWidget * parent )
	:	QWidget( parent )
	,	d( new ToolBarPrivate( this ) )
{
	d->init();

	connect( d->left, &NavigationArrow::clicked,
		this, &ToolBar::_q_leftArrowClicked );

	connect( d->right, &NavigationArrow::clicked,
		this, &ToolBar::_q_rightArrowClicked );
}